

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

void Gia_GlaDumpAbsracted(Gla_Man_t *p,int fVerbose)

{
  char *pcVar1;
  Gia_Man_t *pInit;
  char *pFileName;
  Vec_Int_t *vGateClasses;
  Vec_Int_t *local_20;
  
  pcVar1 = p->pPars->pFileVabs;
  pFileName = "glabs.aig";
  if (pcVar1 != (char *)0x0) {
    pFileName = pcVar1;
  }
  if (fVerbose != 0) {
    Abc_Print((int)p,"Dumping abstracted model into file \"%s\"...\n",pFileName);
  }
  local_20 = Gla_ManTranslate(p);
  pInit = Gia_ManDupAbsGates(p->pGia0,local_20);
  Vec_IntFreeP(&local_20);
  Gia_AigerWrite(pInit,pFileName,0,0);
  Gia_ManStop(pInit);
  return;
}

Assistant:

void Gia_GlaDumpAbsracted( Gla_Man_t * p, int fVerbose )
{
    char * pFileNameDef = "glabs.aig";
    char * pFileName = p->pPars->pFileVabs ? p->pPars->pFileVabs : pFileNameDef;
    Gia_Man_t * pAbs;
    Vec_Int_t * vGateClasses;
    if ( fVerbose )
        Abc_Print( 1, "Dumping abstracted model into file \"%s\"...\n", pFileName );
    // create abstraction
    vGateClasses = Gla_ManTranslate( p );
    pAbs = Gia_ManDupAbsGates( p->pGia0, vGateClasses );
    Vec_IntFreeP( &vGateClasses );
    // write into file
    Gia_AigerWrite( pAbs, pFileName, 0, 0 );
    Gia_ManStop( pAbs );
}